

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Chapter::Display::Clear(Display *this)

{
  anon_unknown_12::StrCpy((char *)0x0,&this->title_);
  anon_unknown_12::StrCpy((char *)0x0,&this->language_);
  anon_unknown_12::StrCpy((char *)0x0,&this->country_);
  return;
}

Assistant:

void Chapter::Display::Clear() {
  StrCpy(NULL, &title_);
  StrCpy(NULL, &language_);
  StrCpy(NULL, &country_);
}